

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O0

t_int * vline_tilde_perform(t_int *w)

{
  double dVar1;
  long lVar2;
  int iVar3;
  double dVar4;
  int local_74;
  double incpermsec;
  double timenext;
  double *pdStack_58;
  int sampstotime;
  t_vseg *s;
  double logicaltimenow;
  double timenow;
  double msecpersamp;
  double inc;
  double f;
  int i;
  int n;
  t_sample *out;
  t_vline *x;
  t_int *w_local;
  
  lVar2 = w[1];
  _i = (float *)w[2];
  iVar3 = (int)w[3];
  inc = *(double *)(lVar2 + 0x30);
  msecpersamp = *(double *)(lVar2 + 0x38);
  dVar1 = *(double *)(lVar2 + 0x60);
  dVar4 = clock_gettimesince(*(double *)(lVar2 + 0x40));
  pdStack_58 = *(double **)(lVar2 + 0x80);
  if ((dVar4 != *(double *)(lVar2 + 0x48)) || (NAN(dVar4) || NAN(*(double *)(lVar2 + 0x48)))) {
    local_74 = iVar3;
    if (iVar3 < 0x41) {
      local_74 = 0x40;
    }
    *(double *)(lVar2 + 0x48) = dVar4;
    *(double *)(lVar2 + 0x50) = -(double)local_74 * dVar1 + dVar4;
  }
  logicaltimenow = *(double *)(lVar2 + 0x50);
  *(double *)(lVar2 + 0x50) = (double)iVar3 * dVar1 + logicaltimenow;
  for (f._0_4_ = 0; f._0_4_ < iVar3; f._0_4_ = f._0_4_ + 1) {
    logicaltimenow = logicaltimenow + dVar1;
    while ((pdStack_58 != (double *)0x0 && (pdStack_58[1] < logicaltimenow))) {
      if (*(double *)(lVar2 + 0x68) <= logicaltimenow) {
        inc = (double)*(float *)(lVar2 + 0x70);
      }
      if (pdStack_58[1] < *pdStack_58) {
        dVar4 = ((double)*(float *)(pdStack_58 + 2) - inc) / (*pdStack_58 - pdStack_58[1]);
        inc = dVar4 * (logicaltimenow - pdStack_58[1]) + inc;
        msecpersamp = dVar4 * dVar1;
      }
      else {
        inc = (double)*(float *)(pdStack_58 + 2);
        msecpersamp = 0.0;
      }
      *(double *)(lVar2 + 0x38) = msecpersamp;
      *(undefined4 *)(lVar2 + 0x70) = *(undefined4 *)(pdStack_58 + 2);
      *(double *)(lVar2 + 0x68) = *pdStack_58;
      *(double *)(lVar2 + 0x80) = pdStack_58[3];
      freebytes(pdStack_58,0x20);
      pdStack_58 = *(double **)(lVar2 + 0x80);
    }
    if (*(double *)(lVar2 + 0x68) <= logicaltimenow) {
      inc = (double)*(float *)(lVar2 + 0x70);
      *(undefined8 *)(lVar2 + 0x38) = 0;
      msecpersamp = 0.0;
      *(undefined8 *)(lVar2 + 0x68) = 0x4415af1d78b58c40;
    }
    *_i = (float)inc;
    inc = inc + msecpersamp;
    _i = _i + 1;
  }
  *(double *)(lVar2 + 0x30) = inc;
  return w + 4;
}

Assistant:

static t_int *vline_tilde_perform(t_int *w)
{
    t_vline *x = (t_vline *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    int n = (int)(w[3]), i;
    double f = x->x_value;
    double inc = x->x_inc;
    double msecpersamp = x->x_msecpersamp;
    double timenow, logicaltimenow = clock_gettimesince(x->x_referencetime);
    t_vseg *s = x->x_list;
    if (logicaltimenow != x->x_lastlogicaltime)
    {
        int sampstotime = (n > DEFDACBLKSIZE ? n : DEFDACBLKSIZE);
        x->x_lastlogicaltime = logicaltimenow;
        x->x_nextblocktime = logicaltimenow - sampstotime * msecpersamp;
    }
    timenow = x->x_nextblocktime;
    x->x_nextblocktime = timenow + n * msecpersamp;
    for (i = 0; i < n; i++)
    {
        double timenext = timenow + msecpersamp;
    checknext:
        if (s)
        {
            /* has starttime elapsed?  If so update value and increment */
            if (s->s_starttime < timenext)
            {
                if (x->x_targettime <= timenext)
                    f = x->x_target, inc = 0;
                    /* if zero-length segment bash output value */
                if (s->s_targettime <= s->s_starttime)
                {
                    f = s->s_target;
                    inc = 0;
                }
                else
                {
                    double incpermsec = (s->s_target - f)/
                        (s->s_targettime - s->s_starttime);
                    f = f + incpermsec * (timenext - s->s_starttime);
                    inc = incpermsec * msecpersamp;
                }
                x->x_inc = inc;
                x->x_target = s->s_target;
                x->x_targettime = s->s_targettime;
                x->x_list = s->s_next;
                t_freebytes(s, sizeof(*s));
                s = x->x_list;
                goto checknext;
            }
        }
        if (x->x_targettime <= timenext)
            f = x->x_target, inc = x->x_inc = 0, x->x_targettime = 1e20;
        *out++ = f;
        f = f + inc;
        timenow = timenext;
    }
    x->x_value = f;
    return (w+4);
}